

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O2

void __thiscall pbrt::ParallelForLoop1D::~ParallelForLoop1D(ParallelForLoop1D *this)

{
  (this->super_ParallelJob)._vptr_ParallelJob = (_func_int **)&PTR__ParallelForLoop1D_03010b98;
  std::_Function_base::~_Function_base(&(this->func).super__Function_base);
  (this->super_ParallelJob)._vptr_ParallelJob = (_func_int **)&PTR__ParallelJob_03010c58;
  return;
}

Assistant:

ParallelForLoop1D(int64_t start, int64_t end, int chunkSize,
                      std::function<void(int64_t, int64_t)> func)
        : func(std::move(func)), nextIndex(start), maxIndex(end), chunkSize(chunkSize) {}